

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O1

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  seq_t sequence;
  seq_t sequence_00;
  bool bVar3;
  U16 *pUVar4;
  ZSTD_DCtx *pZVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  BYTE *op_2;
  size_t sVar9;
  size_t sVar10;
  ZSTD_seqSymbol *pZVar11;
  byte bVar12;
  long lVar13;
  ZSTD_seqSymbol *pZVar14;
  uint uVar15;
  ZSTD_seqSymbol *pZVar16;
  size_t sVar17;
  ulong *puVar18;
  ZSTD_seqSymbol *pZVar19;
  size_t __n;
  BYTE *pBVar20;
  BYTE *pBVar21;
  ulong uVar22;
  ZSTD_seqSymbol *pZVar23;
  ZSTD_seqSymbol *pZVar24;
  size_t seqSize;
  ulong uVar25;
  ZSTD_seqSymbol *oend_00;
  ulong uVar26;
  void *src_00;
  BYTE *oend;
  ulong *puVar27;
  ZSTD_seqSymbol *pZVar28;
  ZSTD_seqSymbol *pZVar29;
  BYTE *litPtr;
  int nbSeq;
  seq_t sequences [4];
  ZSTD_longOffset_e in_stack_fffffffffffffdd8;
  ZSTD_seqSymbol *local_200;
  ulong local_1f0;
  ZSTD_seqSymbol *local_1c8;
  int local_1c0;
  int local_1bc;
  ZSTD_seqSymbol *local_1b8;
  ZSTD_seqSymbol *local_1b0;
  int local_1a4;
  ZSTD_DCtx *local_1a0;
  BIT_DStream_t local_198;
  ZSTD_fseState local_170;
  ZSTD_fseState local_160;
  ZSTD_fseState local_150;
  ZSTD_seqSymbol *local_140 [5];
  BYTE *local_118;
  ZSTD_seqSymbol *local_110;
  ZSTD_seqSymbol *local_108;
  ZSTD_seqSymbol *local_100;
  ZSTD_seqSymbol *local_f8;
  BYTE *local_f0;
  size_t local_e8;
  ulong local_e0;
  ulong *local_d8;
  ulong *local_d0;
  ZSTD_seqSymbol *local_c8;
  ZSTD_seqSymbol *local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8 [15];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  local_1a0 = dctx;
  sVar9 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar9) {
    return sVar9;
  }
  src_00 = (void *)((long)src + sVar9);
  sVar9 = srcSize - sVar9;
  iVar7 = local_1a0->ddictIsCold;
  local_1b0 = (ZSTD_seqSymbol *)dst;
  sVar10 = ZSTD_decodeSeqHeaders(local_1a0,&local_1bc,src_00,sVar9);
  pZVar5 = local_1a0;
  if (0xffffffffffffff88 < sVar10) {
    return sVar10;
  }
  puVar18 = (ulong *)((long)src_00 + sVar10);
  seqSize = sVar9 - sVar10;
  if (iVar7 == 0) {
    if (((frame != 0) && ((local_1a0->fParams).windowSize < 0x1000001)) || (local_1bc < 5)) {
      local_1a0->ddictIsCold = 0;
LAB_00419821:
      sVar9 = ZSTD_decompressSequences
                        (local_1a0,local_1b0,dstCapacity,puVar18,seqSize,local_1bc,
                         in_stack_fffffffffffffdd8);
      return sVar9;
    }
    iVar7 = 0;
    uVar8 = 1;
    do {
      iVar7 = (iVar7 + 1) -
              (uint)(local_1a0->OFTptr[(ulong)(uVar8 - 1) + 1].nbAdditionalBits < 0x17);
      bVar12 = (byte)local_1a0->OFTptr->baseValue;
      uVar6 = uVar8 >> (bVar12 & 0x1f);
      uVar8 = uVar8 + 1;
    } while (uVar6 == 0);
    local_1a0->ddictIsCold = 0;
    if ((uint)(iVar7 << (8 - bVar12 & 0x1f)) < 7) goto LAB_00419821;
  }
  else {
    local_1a0->ddictIsCold = 0;
  }
  local_200 = local_1b0;
  oend_00 = (ZSTD_seqSymbol *)((long)&local_1b0->nextState + dstCapacity);
  local_1c8 = (ZSTD_seqSymbol *)local_1a0->litPtr;
  pZVar16 = (ZSTD_seqSymbol *)((long)&local_1c8->nextState + local_1a0->litSize);
  if (local_1bc != 0) {
    local_140[3] = (ZSTD_seqSymbol *)local_1a0->prefixStart;
    pBVar20 = (BYTE *)local_1a0->virtualStart;
    local_140[4] = (ZSTD_seqSymbol *)local_1a0->dictEnd;
    local_1a0->fseEntropy = 1;
    lVar13 = -0xc;
    do {
      *(ulong *)((long)local_140 + lVar13 * 2 + 0x18) =
           (ulong)*(uint *)((long)local_1a0->workspace + lVar13);
      lVar13 = lVar13 + 4;
    } while (lVar13 != 0);
    iVar7 = 4;
    if (local_1bc < 4) {
      iVar7 = local_1bc;
    }
    local_118 = (BYTE *)((long)local_1b0 - (long)local_140[3]);
    local_110 = pZVar16;
    if (sVar9 == sVar10) {
      local_198.ptr = (char *)0x0;
      local_198.start = (char *)0x0;
      local_198.bitContainer = 0;
      local_198._8_8_ = 0;
      local_198.limitPtr = (char *)0x0;
    }
    else {
      local_198.limitPtr = (char *)(puVar18 + 1);
      local_198.start = (char *)puVar18;
      if (seqSize < 8) {
        local_198.bitContainer = (size_t)(byte)*puVar18;
        switch(seqSize) {
        case 7:
          local_198.bitContainer =
               (ulong)*(byte *)((long)puVar18 + 6) << 0x30 | local_198.bitContainer;
        case 6:
          local_198.bitContainer =
               local_198.bitContainer + ((ulong)*(byte *)((long)puVar18 + 5) << 0x28);
        case 5:
          local_198.bitContainer =
               local_198.bitContainer + ((ulong)*(byte *)((long)puVar18 + 4) << 0x20);
        case 4:
          local_198.bitContainer =
               local_198.bitContainer + (ulong)*(byte *)((long)puVar18 + 3) * 0x1000000;
        case 3:
          local_198.bitContainer =
               local_198.bitContainer + (ulong)*(byte *)((long)puVar18 + 2) * 0x10000;
        case 2:
          local_198.bitContainer =
               local_198.bitContainer + (ulong)*(byte *)((long)puVar18 + 1) * 0x100;
        }
        bVar12 = *(byte *)((long)src_00 + (sVar9 - 1));
        uVar8 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        local_198.bitsConsumed = ~uVar8 + 9;
        if (bVar12 == 0) {
          local_198.bitsConsumed = 0;
        }
        local_1a4 = iVar7;
        local_198.ptr = (char *)puVar18;
        if (bVar12 != 0) {
          local_198.bitsConsumed = local_198.bitsConsumed + (int)seqSize * -8 + 0x40;
LAB_00419911:
          local_1c0 = local_1bc;
          local_1b8 = local_140[3];
          local_1a4 = iVar7;
          local_f8 = local_140[4];
          local_f0 = pBVar20;
          ZSTD_initFseState(&local_170,&local_198,local_1a0->LLTptr);
          ZSTD_initFseState(&local_160,&local_198,pZVar5->OFTptr);
          ZSTD_initFseState(&local_150,&local_198,pZVar5->MLTptr);
          local_1f0 = local_198.bitContainer;
          local_d0 = (ulong *)local_198.limitPtr;
          local_d8 = (ulong *)local_198.start;
          local_100 = local_170.table;
          local_c0 = local_140[4];
          local_c8 = local_140[3];
          local_108 = local_140[1];
          local_e8 = (size_t)local_1a4;
          puVar18 = local_a8 + 1;
          uVar26 = 0;
          pZVar16 = local_140[0];
          puVar27 = (ulong *)local_198.ptr;
          uVar8 = local_198.bitsConsumed;
          do {
            uVar6 = uVar8;
            if (uVar8 < 0x41) {
              if (puVar27 < local_198.limitPtr) {
                if (puVar27 == (ulong *)local_198.start) goto LAB_00419aa7;
                uVar22 = (ulong)(uint)((int)puVar27 - (int)local_198.start);
                if (local_198.start <= (ulong *)((long)puVar27 - (ulong)(uVar8 >> 3))) {
                  uVar22 = (ulong)(uVar8 >> 3);
                }
                uVar6 = uVar8 + (int)uVar22 * -8;
              }
              else {
                uVar22 = (ulong)(uVar8 >> 3);
                uVar6 = uVar8 & 7;
              }
              puVar27 = (ulong *)((long)puVar27 - uVar22);
              local_198.bitsConsumed = uVar6;
              local_1f0 = *puVar27;
              local_198.bitContainer = local_1f0;
              local_198.ptr = (char *)puVar27;
            }
LAB_00419aa7:
            if ((0x40 < uVar8) || ((long)local_e8 <= (long)uVar26)) goto LAB_00419d78;
            bVar12 = local_170.table[local_170.state].nbAdditionalBits;
            bVar1 = local_150.table[local_150.state].nbAdditionalBits;
            bVar2 = local_160.table[local_160.state].nbAdditionalBits;
            local_e0 = (ulong)local_150.table[local_150.state].baseValue;
            if (bVar2 == 0) {
              pZVar28 = (ZSTD_seqSymbol *)0x0;
            }
            else {
              pZVar28 = (ZSTD_seqSymbol *)
                        (((local_1f0 << ((byte)uVar6 & 0x3f)) >> (-bVar2 & 0x3f)) +
                        (ulong)local_160.table[local_160.state].baseValue);
              uVar6 = uVar6 + bVar2;
              local_198._8_8_ = local_198._8_8_ & 0xffffffff00000000;
            }
            if (bVar2 < 2) {
              pBVar20 = (BYTE *)((long)&pZVar28->nextState +
                                (ulong)((ulong)local_170.table[local_170.state].baseValue == 0));
              if (pBVar20 != (BYTE *)0x0) {
                if (pBVar20 == (BYTE *)0x3) {
                  pZVar28 = (ZSTD_seqSymbol *)((long)&pZVar16[-1].baseValue + 3);
                }
                else {
                  pZVar28 = local_140[(long)pBVar20];
                }
                pZVar28 = (ZSTD_seqSymbol *)
                          ((long)&pZVar28->nextState + (ulong)(pZVar28 == (ZSTD_seqSymbol *)0x0));
                if (pBVar20 != (BYTE *)0x1) goto LAB_00419b69;
                goto LAB_00419b79;
              }
            }
            else {
LAB_00419b69:
              local_140[2] = local_108;
LAB_00419b79:
              local_140[1] = pZVar16;
              local_140[0] = pZVar28;
              local_108 = pZVar16;
              pZVar16 = pZVar28;
            }
            if (bVar1 == 0) {
              uVar22 = 0;
            }
            else {
              uVar22 = (local_1f0 << ((byte)uVar6 & 0x3f)) >> (-bVar1 & 0x3f);
              uVar6 = uVar6 + bVar1;
            }
            if ((0x1e < (uint)bVar1 + (uint)bVar12 + (uint)bVar2) && (uVar6 < 0x41)) {
              if (puVar27 < local_198.limitPtr) {
                if (puVar27 == (ulong *)local_198.start) goto LAB_00419c33;
                uVar8 = (int)puVar27 - (int)local_198.start;
                if (local_198.start <= (ulong *)((long)puVar27 - (ulong)(uVar6 >> 3))) {
                  uVar8 = uVar6 >> 3;
                }
                uVar6 = uVar6 + uVar8 * -8;
              }
              else {
                uVar8 = uVar6 >> 3;
                uVar6 = uVar6 & 7;
              }
              puVar27 = (ulong *)((long)puVar27 - (ulong)uVar8);
              local_1f0 = *puVar27;
              local_198.bitContainer = local_1f0;
              local_198.ptr = (char *)puVar27;
            }
LAB_00419c33:
            if (bVar12 == 0) {
              uVar25 = 0;
            }
            else {
              uVar25 = (local_1f0 << ((byte)uVar6 & 0x3f)) >> (-bVar12 & 0x3f);
              uVar6 = uVar6 + bVar12;
            }
            uVar22 = uVar22 + local_150.table[local_150.state].baseValue;
            uVar25 = uVar25 + local_170.table[local_170.state].baseValue;
            pZVar29 = (ZSTD_seqSymbol *)(local_118 + uVar25);
            pZVar28 = local_c8;
            if (pZVar29 < pZVar16) {
              pZVar28 = local_140[4];
            }
            local_118 = (BYTE *)((long)&pZVar29->nextState + uVar22);
            iVar7 = uVar6 + local_170.table[local_170.state].nbBits;
            local_170.state =
                 (ulong)((uint)(local_1f0 >> (-(char)iVar7 & 0x3fU)) &
                        BIT_mask[local_170.table[local_170.state].nbBits]) +
                 (ulong)local_170.table[local_170.state].nextState;
            iVar7 = iVar7 + (uint)local_150.table[local_150.state].nbBits;
            local_150.state =
                 (ulong)((uint)(local_1f0 >> (-(char)iVar7 & 0x3fU)) &
                        BIT_mask[local_150.table[local_150.state].nbBits]) +
                 (ulong)local_150.table[local_150.state].nextState;
            uVar8 = iVar7 + (uint)local_160.table[local_160.state].nbBits;
            local_160.state =
                 (ulong)((uint)(local_1f0 >> (-(char)uVar8 & 0x3fU)) &
                        BIT_mask[local_160.table[local_160.state].nbBits]) +
                 (ulong)local_160.table[local_160.state].nextState;
            puVar18[-3] = uVar25;
            local_198._8_8_ = CONCAT44(local_198._12_4_,uVar8);
            puVar18[-2] = uVar22;
            puVar18[-1] = (ulong)pZVar16;
            *puVar18 = (ulong)((long)pZVar29 + ((long)&pZVar28->nextState - (long)pZVar16));
            uVar26 = uVar26 + 1;
            puVar18 = puVar18 + 4;
          } while( true );
        }
      }
      else {
        local_198.ptr = (char *)((long)src_00 + (sVar9 - 8));
        local_198.bitContainer = *(size_t *)local_198.ptr;
        bVar12 = *(byte *)((long)src_00 + (sVar9 - 1));
        uVar8 = 0x1f;
        if (bVar12 != 0) {
          for (; bVar12 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        local_198.bitsConsumed = ~uVar8 + 9;
        if (bVar12 == 0) {
          local_198.bitsConsumed = 0;
        }
        bVar3 = false;
        pBVar21 = (BYTE *)0xffffffffffffffec;
        if (seqSize < 0xffffffffffffff89) {
          local_1a4 = iVar7;
          if (bVar12 != 0) goto LAB_00419911;
          goto LAB_004196a3;
        }
      }
    }
    bVar3 = false;
    local_200 = local_1b0;
    pBVar21 = (BYTE *)0xffffffffffffffec;
    goto LAB_004196a3;
  }
  goto LAB_00419745;
LAB_00419d78:
  if ((long)uVar26 < (long)local_e8) {
    bVar3 = false;
    local_200 = local_1b0;
    pBVar21 = (BYTE *)0xffffffffffffffec;
  }
  else {
    pZVar16 = oend_00 + -1;
    local_108 = (ZSTD_seqSymbol *)&oend_00[-2].nbBits;
    local_200 = local_1b0;
LAB_00419dcf:
    pZVar28 = local_140[1];
    uVar8 = local_198.bitsConsumed;
    if (local_198.bitsConsumed < 0x41) {
      if (local_198.ptr < local_198.limitPtr) {
        if (local_198.ptr == local_198.start) goto LAB_00419e50;
        uVar6 = (int)local_198.ptr - (int)local_198.start;
        if (local_198.start <= (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3))
           ) {
          uVar6 = local_198.bitsConsumed >> 3;
        }
        uVar15 = local_198.bitsConsumed + uVar6 * -8;
      }
      else {
        uVar6 = local_198.bitsConsumed >> 3;
        uVar15 = local_198.bitsConsumed & 7;
      }
      local_198.ptr = (char *)((long)local_198.ptr - (ulong)uVar6);
      local_198.bitsConsumed = uVar15;
      local_198.bitContainer = *(size_t *)local_198.ptr;
    }
LAB_00419e50:
    uVar6 = (uint)uVar26;
    if ((uVar8 < 0x41) && ((int)uVar6 < local_1c0)) {
      bVar12 = local_170.table[local_170.state].nbAdditionalBits;
      bVar1 = local_150.table[local_150.state].nbAdditionalBits;
      bVar2 = local_160.table[local_160.state].nbAdditionalBits;
      if (bVar2 == 0) {
        pZVar29 = (ZSTD_seqSymbol *)0x0;
      }
      else {
        pZVar29 = (ZSTD_seqSymbol *)
                  (((local_198.bitContainer << ((byte)local_198.bitsConsumed & 0x3f)) >>
                   (-bVar2 & 0x3f)) + (ulong)local_160.table[local_160.state].baseValue);
        local_198.bitsConsumed = local_198.bitsConsumed + bVar2;
      }
      if (bVar2 < 2) {
        pBVar20 = (BYTE *)((long)&pZVar29->nextState +
                          (ulong)((ulong)local_170.table[local_170.state].baseValue == 0));
        if (pBVar20 != (BYTE *)0x0) {
          if (pBVar20 == (BYTE *)0x3) {
            pZVar28 = (ZSTD_seqSymbol *)((long)&local_140[0][-1].baseValue + 3);
          }
          else {
            pZVar28 = local_140[(long)pBVar20];
          }
          if (pBVar20 != (BYTE *)0x1) {
            local_140[2] = local_140[1];
          }
          local_140[1] = local_140[0];
          local_140[0] = (ZSTD_seqSymbol *)
                         ((long)&pZVar28->nextState + (ulong)(pZVar28 == (ZSTD_seqSymbol *)0x0));
        }
      }
      else {
        local_140[1] = local_140[0];
        local_140[2] = pZVar28;
        local_140[0] = pZVar29;
      }
      if (bVar1 == 0) {
        uVar26 = 0;
      }
      else {
        uVar26 = (local_198.bitContainer << ((byte)local_198.bitsConsumed & 0x3f)) >>
                 (-bVar1 & 0x3f);
        local_198.bitsConsumed = local_198.bitsConsumed + bVar1;
      }
      local_100 = local_140[0];
      if ((0x1e < (uint)bVar1 + (uint)bVar12 + (uint)bVar2) && (local_198.bitsConsumed < 0x41)) {
        if (local_198.ptr < local_198.limitPtr) {
          if (local_198.ptr == local_198.start) goto LAB_0041a04a;
          uVar22 = (ulong)(uint)((int)local_198.ptr - (int)local_198.start);
          if (local_198.start <=
              (ulong *)((long)local_198.ptr - (ulong)(local_198.bitsConsumed >> 3))) {
            uVar22 = (ulong)(local_198.bitsConsumed >> 3);
          }
          uVar8 = local_198.bitsConsumed + (int)uVar22 * -8;
        }
        else {
          uVar22 = (ulong)(local_198.bitsConsumed >> 3);
          uVar8 = local_198.bitsConsumed & 7;
        }
        local_198.ptr = (char *)((long)local_198.ptr - uVar22);
        local_198.bitsConsumed = uVar8;
        local_198.bitContainer = *(size_t *)local_198.ptr;
      }
LAB_0041a04a:
      if (bVar12 == 0) {
        uVar22 = 0;
      }
      else {
        uVar22 = (local_198.bitContainer << ((byte)local_198.bitsConsumed & 0x3f)) >>
                 (-bVar12 & 0x3f);
        local_198.bitsConsumed = local_198.bitsConsumed + bVar12;
      }
      lVar13 = uVar26 + local_150.table[local_150.state].baseValue;
      uVar22 = uVar22 + local_170.table[local_170.state].baseValue;
      pZVar11 = (ZSTD_seqSymbol *)(local_118 + uVar22);
      pZVar29 = local_140[(ulong)(pZVar11 < local_140[0]) + 3];
      local_118 = (BYTE *)((long)&pZVar11->nextState + lVar13);
      iVar7 = local_198.bitsConsumed + local_170.table[local_170.state].nbBits;
      local_170.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                  BIT_mask[local_170.table[local_170.state].nbBits]) +
           (ulong)local_170.table[local_170.state].nextState;
      iVar7 = iVar7 + (uint)local_150.table[local_150.state].nbBits;
      local_150.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                  BIT_mask[local_150.table[local_150.state].nbBits]) +
           (ulong)local_150.table[local_150.state].nextState;
      iVar7 = iVar7 + (uint)local_160.table[local_160.state].nbBits;
      local_198._8_8_ = CONCAT44(local_198._12_4_,iVar7);
      local_160.state =
           (ulong)((uint)(local_198.bitContainer >> (-(char)iVar7 & 0x3fU)) &
                  BIT_mask[local_160.table[local_160.state].nbBits]) +
           (ulong)local_160.table[local_160.state].nextState;
      uVar25 = (ulong)((uVar6 & 3) << 5);
      puVar18 = (ulong *)((long)&local_b8 + uVar25);
      uVar26 = *puVar18;
      sVar17 = *(size_t *)((long)&local_b0 + uVar25);
      pBVar20 = (BYTE *)(sVar17 + uVar26);
      pZVar28 = (ZSTD_seqSymbol *)((long)&local_200->nextState + (long)pBVar20);
      pBVar21 = (BYTE *)0xffffffffffffffba;
      if (pZVar28 <= oend_00) {
        pZVar24 = (ZSTD_seqSymbol *)((long)&local_1c8->nextState + uVar26);
        pBVar21 = (BYTE *)0xffffffffffffffec;
        if (pZVar24 <= local_110) {
          pZVar14 = (ZSTD_seqSymbol *)((long)&local_200->nextState + uVar26);
          if (pZVar16 < pZVar14) {
            sequence.matchLength = *(undefined8 *)((long)&local_b0 + uVar25);
            sequence.litLength = *puVar18;
            sequence.offset = *(undefined8 *)((long)local_a8 + uVar25);
            sequence.match = *(BYTE **)((long)local_a8 + uVar25 + 8);
            pBVar21 = (BYTE *)ZSTD_execSequenceLast7
                                        ((BYTE *)local_200,(BYTE *)oend_00,sequence,
                                         (BYTE **)&local_1c8,(BYTE *)local_110,(BYTE *)local_1b8,
                                         local_f0,(BYTE *)local_f8);
          }
          else {
            local_e0 = *(ulong *)((long)local_a8 + uVar25);
            pZVar23 = *(ZSTD_seqSymbol **)((long)local_a8 + uVar25 + 8);
            *local_200 = *local_1c8;
            if (8 < uVar26) {
              pZVar19 = local_200 + 1;
              do {
                local_1c8 = local_1c8 + 1;
                *pZVar19 = *local_1c8;
                pZVar19 = pZVar19 + 1;
              } while (pZVar19 < pZVar14);
            }
            local_1c8 = pZVar24;
            if ((ulong)((long)pZVar14 - (long)local_1b8) < local_e0) {
              if (local_e0 <= (ulong)((long)pZVar14 - (long)local_f0)) {
                if (local_f8 < (ZSTD_seqSymbol *)((long)&pZVar23->nextState + sVar17)) {
                  local_e8 = (long)local_f8 - (long)pZVar23;
                  memmove(pZVar14,pZVar23,local_e8);
                  pZVar14 = (ZSTD_seqSymbol *)((long)&pZVar14->nextState + local_e8);
                  sVar17 = sVar17 - local_e8;
                  if ((pZVar14 <= pZVar16) && (pZVar23 = local_1b8, 2 < sVar17)) goto LAB_0041a323;
                  pBVar21 = pBVar20;
                  if (sVar17 != 0) {
                    uVar26 = 0;
                    do {
                      *(BYTE *)((long)&pZVar14->nextState + uVar26) =
                           *(BYTE *)((long)&local_1b8->nextState + uVar26);
                      uVar26 = uVar26 + 1;
                    } while ((uVar26 & 0xffffffff) < sVar17);
                  }
                }
                else {
                  memmove(pZVar14,pZVar23,sVar17);
                  pBVar21 = pBVar20;
                }
              }
            }
            else {
LAB_0041a323:
              if (local_e0 < 8) {
                iVar7 = *(int *)(ZSTD_execSequence_dec64table + local_e0 * 4);
                *(BYTE *)&pZVar14->nextState = (BYTE)pZVar23->nextState;
                *(BYTE *)((long)&pZVar14->nextState + 1) = *(BYTE *)((long)&pZVar23->nextState + 1);
                pZVar14->nbAdditionalBits = pZVar23->nbAdditionalBits;
                pZVar14->nbBits = pZVar23->nbBits;
                pUVar4 = &pZVar23->nextState;
                pZVar23 = (ZSTD_seqSymbol *)
                          ((long)pZVar23 +
                          ((ulong)*(uint *)(ZSTD_execSequence_dec32table + local_e0 * 4) -
                          (long)iVar7));
                pZVar14->baseValue =
                     *(U32 *)((long)pUVar4 +
                             (ulong)*(uint *)(ZSTD_execSequence_dec32table + local_e0 * 4));
              }
              else {
                *pZVar14 = *pZVar23;
              }
              pZVar24 = pZVar14 + 1;
              pZVar23 = pZVar23 + 1;
              if (local_108 < pZVar28) {
                pZVar14 = pZVar24;
                pZVar19 = pZVar23;
                if (pZVar24 < pZVar16) {
                  do {
                    *pZVar14 = *pZVar19;
                    pZVar14 = pZVar14 + 1;
                    pZVar19 = pZVar19 + 1;
                  } while (pZVar14 < pZVar16);
                  pZVar23 = (ZSTD_seqSymbol *)((long)pZVar23 + ((long)pZVar16 - (long)pZVar24));
                  pZVar24 = pZVar16;
                }
                for (; pBVar21 = pBVar20, pZVar24 < pZVar28;
                    pZVar24 = (ZSTD_seqSymbol *)((long)&pZVar24->nextState + 1)) {
                  pUVar4 = &pZVar23->nextState;
                  pZVar23 = (ZSTD_seqSymbol *)((long)&pZVar23->nextState + 1);
                  *(BYTE *)&pZVar24->nextState = (BYTE)*pUVar4;
                }
              }
              else {
                do {
                  *pZVar24 = *pZVar23;
                  pZVar24 = pZVar24 + 1;
                  pZVar23 = pZVar23 + 1;
                  pBVar21 = pBVar20;
                } while (pZVar24 < (ZSTD_seqSymbol *)((long)&pZVar14->nextState + sVar17));
              }
            }
          }
        }
      }
      if ((BYTE *)0xffffffffffffff88 < pBVar21) goto LAB_0041a49f;
      *puVar18 = uVar22;
      *(long *)((long)&local_b0 + uVar25) = lVar13;
      *(ZSTD_seqSymbol **)((long)local_a8 + uVar25) = local_100;
      *(BYTE **)((long)local_a8 + uVar25 + 8) =
           (BYTE *)((long)pZVar11 + ((long)pZVar29 - (long)local_100));
      local_200 = (ZSTD_seqSymbol *)((long)&local_200->nextState + (long)pBVar21);
      uVar26 = (ulong)(uVar6 + 1);
      goto LAB_00419dcf;
    }
    if (local_1c0 <= (int)uVar6) {
      uVar6 = uVar6 - local_1a4;
      if ((int)uVar6 < local_1c0) goto LAB_0041a4bc;
      goto LAB_0041a779;
    }
    pBVar21 = (BYTE *)0xffffffffffffffec;
LAB_0041a49f:
    bVar3 = false;
  }
  goto LAB_004196a3;
  while (uVar6 = uVar6 + 1, (int)uVar6 < local_1c0) {
LAB_0041a4bc:
    uVar22 = (ulong)((uVar6 & 3) << 5);
    uVar26 = *(ulong *)((long)&local_b8 + uVar22);
    sVar17 = *(size_t *)((long)&local_b0 + uVar22);
    pBVar20 = (BYTE *)(sVar17 + uVar26);
    pZVar28 = (ZSTD_seqSymbol *)((long)&local_200->nextState + (long)pBVar20);
    pBVar21 = (BYTE *)0xffffffffffffffba;
    if (pZVar28 <= oend_00) {
      pZVar29 = (ZSTD_seqSymbol *)((long)&local_1c8->nextState + uVar26);
      pBVar21 = (BYTE *)0xffffffffffffffec;
      if (pZVar29 <= local_110) {
        pZVar11 = (ZSTD_seqSymbol *)((long)&local_200->nextState + uVar26);
        if (pZVar16 < pZVar11) {
          sequence_00.matchLength = *(undefined8 *)((long)&local_b0 + uVar22);
          sequence_00.litLength = *(undefined8 *)((long)&local_b8 + uVar22);
          sequence_00.offset = *(undefined8 *)((long)local_a8 + uVar22);
          sequence_00.match = *(BYTE **)((long)local_a8 + uVar22 + 8);
          pBVar21 = (BYTE *)ZSTD_execSequenceLast7
                                      ((BYTE *)local_200,(BYTE *)oend_00,sequence_00,
                                       (BYTE **)&local_1c8,(BYTE *)local_110,(BYTE *)local_1b8,
                                       local_f0,(BYTE *)local_f8);
        }
        else {
          uVar25 = *(ulong *)((long)local_a8 + uVar22);
          pZVar24 = *(ZSTD_seqSymbol **)((long)local_a8 + uVar22 + 8);
          *local_200 = *local_1c8;
          if (8 < uVar26) {
            pZVar14 = local_200 + 1;
            do {
              local_1c8 = local_1c8 + 1;
              *pZVar14 = *local_1c8;
              pZVar14 = pZVar14 + 1;
            } while (pZVar14 < pZVar11);
          }
          local_1c8 = pZVar29;
          if ((ulong)((long)pZVar11 - (long)local_1b8) < uVar25) {
            if (uVar25 <= (ulong)((long)pZVar11 - (long)local_f0)) {
              if (local_f8 < (ZSTD_seqSymbol *)((long)&pZVar24->nextState + sVar17)) {
                __n = (long)local_f8 - (long)pZVar24;
                memmove(pZVar11,pZVar24,__n);
                pZVar11 = (ZSTD_seqSymbol *)((long)pZVar11 + __n);
                sVar17 = sVar17 - __n;
                if ((pZVar11 <= pZVar16) && (pZVar24 = local_1b8, 2 < sVar17)) goto LAB_0041a64f;
                pBVar21 = pBVar20;
                if (sVar17 != 0) {
                  uVar26 = 0;
                  do {
                    *(BYTE *)((long)&pZVar11->nextState + uVar26) =
                         *(BYTE *)((long)&local_1b8->nextState + uVar26);
                    uVar26 = uVar26 + 1;
                  } while ((uVar26 & 0xffffffff) < sVar17);
                }
              }
              else {
                memmove(pZVar11,pZVar24,sVar17);
                pBVar21 = pBVar20;
              }
            }
          }
          else {
LAB_0041a64f:
            if (uVar25 < 8) {
              iVar7 = *(int *)(ZSTD_execSequence_dec64table + uVar25 * 4);
              *(BYTE *)&pZVar11->nextState = (BYTE)pZVar24->nextState;
              *(BYTE *)((long)&pZVar11->nextState + 1) = *(BYTE *)((long)&pZVar24->nextState + 1);
              pZVar11->nbAdditionalBits = pZVar24->nbAdditionalBits;
              pZVar11->nbBits = pZVar24->nbBits;
              pUVar4 = &pZVar24->nextState;
              pZVar24 = (ZSTD_seqSymbol *)
                        ((long)pZVar24 +
                        ((ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar25 * 4) - (long)iVar7))
              ;
              pZVar11->baseValue =
                   *(U32 *)((long)pUVar4 +
                           (ulong)*(uint *)(ZSTD_execSequence_dec32table + uVar25 * 4));
            }
            else {
              *pZVar11 = *pZVar24;
            }
            pZVar29 = pZVar11 + 1;
            pZVar24 = pZVar24 + 1;
            if (local_108 < pZVar28) {
              pZVar11 = pZVar29;
              pZVar14 = pZVar24;
              if (pZVar29 < pZVar16) {
                do {
                  *pZVar11 = *pZVar14;
                  pZVar11 = pZVar11 + 1;
                  pZVar14 = pZVar14 + 1;
                } while (pZVar11 < pZVar16);
                pZVar24 = (ZSTD_seqSymbol *)((long)pZVar24 + ((long)pZVar16 - (long)pZVar29));
                pZVar29 = pZVar16;
              }
              for (; pBVar21 = pBVar20, pZVar29 < pZVar28;
                  pZVar29 = (ZSTD_seqSymbol *)((long)&pZVar29->nextState + 1)) {
                pUVar4 = &pZVar24->nextState;
                pZVar24 = (ZSTD_seqSymbol *)((long)&pZVar24->nextState + 1);
                *(BYTE *)&pZVar29->nextState = (BYTE)*pUVar4;
              }
            }
            else {
              do {
                *pZVar29 = *pZVar24;
                pZVar29 = pZVar29 + 1;
                pZVar24 = pZVar24 + 1;
                pBVar21 = pBVar20;
              } while (pZVar29 < (ZSTD_seqSymbol *)((long)&pZVar11->nextState + sVar17));
            }
          }
        }
      }
    }
    bVar3 = false;
    pBVar20 = (BYTE *)0x0;
    if (pBVar21 < (BYTE *)0xffffffffffffff89) {
      pBVar20 = pBVar21;
    }
    local_200 = (ZSTD_seqSymbol *)((long)&local_200->nextState + (long)pBVar20);
    if ((BYTE *)0xffffffffffffff88 < pBVar21) goto LAB_004196a3;
  }
LAB_0041a779:
  lVar13 = 0;
  do {
    (local_1a0->entropy).rep[lVar13] = *(U32 *)(local_140 + lVar13);
    lVar13 = lVar13 + 1;
    bVar3 = true;
    pBVar21 = (BYTE *)0xffffffffffffffec;
  } while (lVar13 != 3);
LAB_004196a3:
  pZVar16 = local_110;
  if (bVar3) {
LAB_00419745:
    pZVar28 = local_1b0;
    sVar17 = (long)pZVar16 - (long)local_1c8;
    if ((ulong)((long)oend_00 - (long)local_200) < sVar17) {
      pBVar21 = (BYTE *)0xffffffffffffffba;
    }
    else {
      memcpy(local_200,local_1c8,sVar17);
      pBVar21 = (BYTE *)((long)local_200 + (sVar17 - (long)pZVar28));
    }
  }
  return (size_t)pBVar21;
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    if (srcSize >= ZSTD_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}